

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O1

Node * CleanTree(TidyDocImpl *doc,Node *node)

{
  Node *pNVar1;
  
  for (pNVar1 = node->content; pNVar1 != (Node *)0x0; pNVar1 = pNVar1->next) {
    pNVar1 = CleanTree(doc,pNVar1);
    if (pNVar1 == (Node *)0x0) break;
  }
  pNVar1 = CleanNode(doc,node);
  return pNVar1;
}

Assistant:

static Node* CleanTree( TidyDocImpl* doc, Node *node )
{
    if (node->content)
    {
        Node *child;
        for (child = node->content; child != NULL; child = child->next)
        {
            child = CleanTree( doc, child );
            if ( !child )
                break;
        }
    }

    return CleanNode( doc, node );
}